

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_reader<char,jsoncons::stream_source<char>,std::allocator<char>>::
basic_json_reader<std::istream&>
          (basic_json_reader<char,jsoncons::stream_source<char>,std::allocator<char>> *this,
          basic_istream<char,_std::char_traits<char>_> *source,basic_json_visitor<char> *visitor,
          basic_json_decode_options<char> *options,
          function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *temp_alloc)

{
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> fStack_48;
  
  json_source_adaptor<jsoncons::stream_source<char>>::json_source_adaptor<std::istream&>
            ((json_source_adaptor<jsoncons::stream_source<char>> *)this,source);
  *(undefined ***)(this + 0x1a0) = &PTR__basic_json_visitor_00997518;
  *(basic_json_visitor<char> **)(this + 0x1a8) = visitor;
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            (&fStack_48,err_handler);
  basic_json_parser<char,_std::allocator<char>_>::basic_json_parser
            ((basic_json_parser<char,_std::allocator<char>_> *)(this + 0x1b0),options,&fStack_48,
             temp_alloc);
  std::_Function_base::~_Function_base(&fStack_48.super__Function_base);
  return;
}

Assistant:

basic_json_reader(Sourceable&& source,
                          basic_json_visitor<CharT>& visitor, 
                          const basic_json_decode_options<CharT>& options,
                          std::function<bool(json_errc,const ser_context&)> err_handler, 
                          const TempAllocator& temp_alloc = TempAllocator())
           : source_(std::forward<Sourceable>(source)),
             visitor_(visitor),
             parser_(options,err_handler,temp_alloc)
        {
        }